

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O0

bool __thiscall BmsChannel::IsFirstPlayerNoteChannel(BmsChannel *this)

{
  int iVar1;
  BmsChannel *this_local;
  
  iVar1 = GetChannelType(this);
  if ((iVar1 == 0xb) || (iVar1 == 0x33)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BmsChannel::IsFirstPlayerNoteChannel(void) const
{
	switch (GetChannelType()) {
	case BmsChannelType::FIRSTPLAYER:
	case BmsChannelType::FIRSTPLAYERLN:
		return true;
	default:
		return false;
	}
}